

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comoment_suite.cpp
# Opt level: O0

void double_suite::test_exponential_increase(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  double absolute_tolerance;
  double *in_stack_fffffffffffffdc8;
  double local_228;
  value_type local_220;
  value_type local_218;
  double local_208;
  value_type local_200;
  value_type local_1f8;
  double local_1e8;
  value_type local_1e0;
  value_type local_1d8;
  double local_1c8;
  value_type local_1c0;
  value_type local_1b8;
  double local_1a8;
  value_type local_1a0;
  value_type local_198;
  double local_188;
  value_type local_180;
  value_type local_178;
  double local_168;
  value_type local_160;
  value_type local_158;
  double local_148;
  value_type local_140;
  value_type local_138;
  double local_128;
  value_type local_120;
  value_type local_118;
  double local_108;
  value_type local_100;
  value_type local_f8;
  double local_e8;
  value_type local_e0;
  value_type local_d8;
  double local_c8;
  value_type local_c0 [4];
  undefined8 local_a0;
  value_type local_98 [2];
  undefined1 local_88 [8];
  covariance<double,_4> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.sum.xy,1e-05,absolute_tolerance);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::basic_comoment
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88,1.0,1.0);
  local_98[0] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                          ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_a0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x143,"void double_suite::test_exponential_increase()",local_98,&local_a0);
  local_c0[2] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
                unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_c0[1] = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,0x144,"void double_suite::test_exponential_increase()",local_c0 + 2,local_c0 + 1);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88,10.0,10.0);
  local_c0[0] = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                          ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_c8 = 20.25;
  local_d8 = filter.sum.xy;
  predicate_10.absolute = tolerance.relative;
  predicate_10.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","20.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x146,0x10b503,(char *)local_c0,&local_c8,in_stack_fffffffffffffdc8,
             predicate_10);
  local_e0 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
             unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_e8 = 40.5;
  local_f8 = filter.sum.xy;
  predicate_09.absolute = tolerance.relative;
  predicate_09.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_variance()","40.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x147,0x10b503,(char *)&local_e0,&local_e8,in_stack_fffffffffffffdc8,
             predicate_09);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88,100.0,100.0);
  local_100 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_108 = 1998.0;
  local_118 = filter.sum.xy;
  predicate_08.absolute = tolerance.relative;
  predicate_08.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1998.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x149,0x10b503,(char *)&local_100,&local_108,in_stack_fffffffffffffdc8,
             predicate_08);
  local_120 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
              unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_128 = 2997.0;
  local_138 = filter.sum.xy;
  predicate_07.absolute = tolerance.relative;
  predicate_07.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_variance()","2997.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x14a,0x10b503,(char *)&local_120,&local_128,in_stack_fffffffffffffdc8,
             predicate_07);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88,1000.0,1000.0);
  local_140 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_148 = 175380.0;
  local_158 = filter.sum.xy;
  predicate_06.absolute = tolerance.relative;
  predicate_06.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.7538e5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x14c,0x10b503,(char *)&local_140,&local_148,in_stack_fffffffffffffdc8,
             predicate_06);
  local_160 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
              unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_168 = 233840.0;
  local_178 = filter.sum.xy;
  predicate_05.absolute = tolerance.relative;
  predicate_05.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_variance()","2.3384e5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x14d,0x10b503,(char *)&local_160,&local_168,in_stack_fffffffffffffdc8,
             predicate_05);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88,10000.0,10000.0);
  local_180 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_188 = 17538000.0;
  local_198 = filter.sum.xy;
  predicate_04.absolute = tolerance.relative;
  predicate_04.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.7538e7","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x14f,0x10b503,(char *)&local_180,&local_188,in_stack_fffffffffffffdc8,
             predicate_04);
  local_1a0 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
              unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_1a8 = 23384000.0;
  local_1b8 = filter.sum.xy;
  predicate_03.absolute = tolerance.relative;
  predicate_03.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_variance()","2.3384e7","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x150,0x10b503,(char *)&local_1a0,&local_1a8,in_stack_fffffffffffffdc8,
             predicate_03);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88,100000.0,100000.0);
  local_1c0 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_1c8 = 1753800000.0;
  local_1d8 = filter.sum.xy;
  predicate_02.absolute = tolerance.relative;
  predicate_02.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.7538e9","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x152,0x10b503,(char *)&local_1c0,&local_1c8,in_stack_fffffffffffffdc8,
             predicate_02);
  local_1e0 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
              unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_1e8 = 2338400000.0;
  local_1f8 = filter.sum.xy;
  predicate_01.absolute = tolerance.relative;
  predicate_01.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_variance()","2.3384e9","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x153,0x10b503,(char *)&local_1e0,&local_1e8,in_stack_fffffffffffffdc8,
             predicate_01);
  trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88,1000000.0,1000000.0);
  local_200 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::variance
                        ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_208 = 175380000000.0;
  local_218 = filter.sum.xy;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","1.7538e11","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x155,0x10b503,(char *)&local_200,&local_208,in_stack_fffffffffffffdc8,
             predicate_00);
  local_220 = trial::online::window::basic_comoment<double,_4UL,_(trial::online::with)2>::
              unbiased_variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_88);
  local_228 = 233840000000.0;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.sum.xy;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_variance()","2.3384e11","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/comoment_suite.cpp"
             ,(char *)0x156,0x10b503,(char *)&local_220,&local_228,(double *)filter.sum.xy,predicate
            );
  return;
}

Assistant:

void test_exponential_increase()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    window::covariance<double, 4> filter;
    filter.push(1e0, 1e0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_variance(), 0.0);
    filter.push(1e1, 1e1);
    TRIAL_TEST_WITH(filter.variance(), 20.25, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_variance(), 40.5, tolerance);
    filter.push(1e2, 1e2);
    TRIAL_TEST_WITH(filter.variance(), 1998.0, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_variance(), 2997.0, tolerance);
    filter.push(1e3, 1e3);
    TRIAL_TEST_WITH(filter.variance(), 1.7538e5, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_variance(), 2.3384e5, tolerance);
    filter.push(1e4, 1e4);
    TRIAL_TEST_WITH(filter.variance(), 1.7538e7, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_variance(), 2.3384e7, tolerance);
    filter.push(1e5, 1e5);
    TRIAL_TEST_WITH(filter.variance(), 1.7538e9, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_variance(), 2.3384e9, tolerance);
    filter.push(1e6, 1e6);
    TRIAL_TEST_WITH(filter.variance(), 1.7538e11, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_variance(), 2.3384e11, tolerance);
}